

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::TruncateOutputLog(cmake *this,char *fname)

{
  cmState *this_00;
  int iVar1;
  string *psVar2;
  cmValue cVar3;
  string fullPath;
  stat st;
  allocator<char> local_101;
  undefined1 local_100 [48];
  string local_d0;
  char *local_b0;
  stat local_a8;
  
  local_b0 = fname;
  psVar2 = GetHomeOutputDirectory_abi_cxx11_(this);
  local_a8.st_ino = (__ino_t)(psVar2->_M_dataplus)._M_p;
  local_a8.st_dev = psVar2->_M_string_length;
  local_100._8_8_ = local_100 + 0x10;
  local_100._0_8_ = (pointer)0x1;
  local_100[0x10] = '/';
  cmStrCat<char_const*>(&local_d0,(cmAlphaNum *)&local_a8,(cmAlphaNum *)local_100,&local_b0);
  iVar1 = stat(local_d0._M_dataplus._M_p,&local_a8);
  if (iVar1 == 0) {
    this_00 = (this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
              super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
              super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_100,"CMAKE_CACHEFILE_DIR",&local_101);
    cVar3 = cmState::GetInitializedCacheValue(this_00,(string *)local_100);
    std::__cxx11::string::~string((string *)local_100);
    if (cVar3.Value == (string *)0x0) {
      cmsys::SystemTools::RemoveFile(&local_d0);
    }
  }
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void cmake::TruncateOutputLog(const char* fname)
{
  std::string fullPath = cmStrCat(this->GetHomeOutputDirectory(), '/', fname);
  struct stat st;
  if (::stat(fullPath.c_str(), &st)) {
    return;
  }
  if (!this->State->GetInitializedCacheValue("CMAKE_CACHEFILE_DIR")) {
    cmSystemTools::RemoveFile(fullPath);
    return;
  }
  off_t fsize = st.st_size;
  const off_t maxFileSize = 50 * 1024;
  if (fsize < maxFileSize) {
    // TODO: truncate file
    return;
  }
}